

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall GameBoard::eliminate(GameBoard *this,int color)

{
  bool bVar1;
  bool bVar2;
  int *piVar3;
  int local_34;
  int fullFlag;
  int emptyFlag;
  int j;
  int i;
  int *count;
  int color_local;
  GameBoard *this_local;
  
  piVar3 = this->transCount + color;
  this->transCount[color] = 0;
  this->maxHeight[color] = 0x14;
  i = 1;
  do {
    if (0x14 < i) {
LAB_00138f70:
      this->maxHeight[color] = this->maxHeight[color] - *piVar3;
      this->elimTotal[color] = elimBonus[*piVar3] + this->elimTotal[color];
      return;
    }
    bVar2 = true;
    bVar1 = true;
    for (j = 1; j < 0xb; j = j + 1) {
      if (this->gridInfo[color][i][j] == 0) {
        bVar1 = false;
      }
      else {
        bVar2 = false;
      }
    }
    if (bVar1) {
      for (j = 1; j < 0xb; j = j + 1) {
        this->trans[color][*piVar3][j] = (uint)(this->gridInfo[color][i][j] == 1);
        this->gridInfo[color][i][j] = 0;
      }
      *piVar3 = *piVar3 + 1;
    }
    else {
      if (bVar2) {
        this->maxHeight[color] = i + -1;
        goto LAB_00138f70;
      }
      for (j = 1; j < 0xb; j = j + 1) {
        if (this->gridInfo[color][i][j] < 1) {
          local_34 = this->gridInfo[color][i][j];
        }
        else {
          local_34 = 1;
        }
        this->gridInfo[color][i - *piVar3][j] = local_34;
        if (*piVar3 != 0) {
          this->gridInfo[color][i][j] = 0;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void GameBoard::eliminate(int color)
{
    int &count = transCount[color] = 0;
    int i, j, emptyFlag, fullFlag;
    maxHeight[color] = MAPHEIGHT;
    for (i = 1; i <= MAPHEIGHT; i++) {
        emptyFlag = 1;
        fullFlag = 1;
        for (j = 1; j <= MAPWIDTH; j++) {
            if (gridInfo[color][i][j] == 0)
                fullFlag = 0;
            else
                emptyFlag = 0;
        }
        if (fullFlag) {
            for (j = 1; j <= MAPWIDTH; j++) {
                // 注意这里只转移以前的块，不包括最后一次落下的块（“撤销最后一步”）
                trans[color][count][j] = gridInfo[color][i][j] == 1 ? 1 : 0;
                gridInfo[color][i][j] = 0;
            }
            count++;
        }
        else if (emptyFlag) {
            maxHeight[color] = i - 1;
            break;
        }
        else
            for (j = 1; j <= MAPWIDTH; j++) {
                gridInfo[color][i - count][j] =
                    gridInfo[color][i][j] > 0 ? 1 : gridInfo[color][i][j];
                if (count)
                    gridInfo[color][i][j] = 0;
            }
    }
    maxHeight[color] -= count;
    elimTotal[color] += elimBonus[count];
}